

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O1

bool __thiscall GNUmakeTokenPoolPosix::AcquireToken(GNUmakeTokenPoolPosix *this)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char buf;
  itimerval timeout_1;
  timeval timeout;
  sigaction old_act;
  fd_set set;
  sigaction act;
  undefined1 local_1f9;
  itimerval local_1f8;
  timeval local_1d8;
  sigaction local_1c0;
  fd_set local_128;
  sigaction local_a0;
  
  local_1d8.tv_sec = 0;
  local_1d8.tv_usec = 0;
  local_128.fds_bits[0] = 0;
  local_128.fds_bits[1] = 0;
  local_128.fds_bits[2] = 0;
  local_128.fds_bits[3] = 0;
  local_128.fds_bits[4] = 0;
  local_128.fds_bits[5] = 0;
  local_128.fds_bits[6] = 0;
  local_128.fds_bits[7] = 0;
  local_128.fds_bits[8] = 0;
  local_128.fds_bits[9] = 0;
  local_128.fds_bits[10] = 0;
  local_128.fds_bits[0xb] = 0;
  local_128.fds_bits[0xc] = 0;
  local_128.fds_bits[0xd] = 0;
  local_128.fds_bits[0xe] = 0;
  local_128.fds_bits[0xf] = 0;
  iVar2 = this->rfd_;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_128.fds_bits[iVar1 >> 6] =
       local_128.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
  iVar2 = select(iVar2 + 1,&local_128,(fd_set *)0x0,(fd_set *)0x0,&local_1d8);
  if ((0 < iVar2) && (dup_rfd_ = dup(this->rfd_), dup_rfd_ != -1)) {
    memset(&local_a0,0,0x98);
    local_a0.__sigaction_handler.sa_handler = CloseDupRfd;
    iVar2 = sigaction(0x11,&local_a0,&local_1c0);
    if (iVar2 == 0) {
      local_1f8.it_value.tv_sec = 0;
      local_1f8.it_interval.tv_sec = 0;
      local_1f8.it_interval.tv_usec = 0;
      local_1f8.it_value.tv_usec = 100000;
      iVar2 = setitimer(ITIMER_REAL,&local_1f8,(itimerval *)0x0);
      if (iVar2 == 0) {
        sVar3 = read(dup_rfd_,&local_1f9,1);
        local_1f8.it_interval.tv_sec = 0;
        local_1f8.it_interval.tv_usec = 0;
        local_1f8.it_value.tv_sec = 0;
        local_1f8.it_value.tv_usec = 0;
        setitimer(ITIMER_REAL,&local_1f8,(itimerval *)0x0);
        sigaction(0x11,&local_1c0,(sigaction *)0x0);
        close(dup_rfd_);
        if ((int)sVar3 < 1) {
          dup_rfd_ = -1;
          return false;
        }
        dup_rfd_ = -1;
        return true;
      }
      sigaction(0x11,&local_1c0,(sigaction *)0x0);
    }
    close(dup_rfd_);
    dup_rfd_ = -1;
  }
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::AcquireToken() {
  // Please read
  //
  //   http://make.mad-scientist.net/papers/jobserver-implementation/
  //
  // for the reasoning behind the following code.
  //
  // Try to read one character from the pipe. Returns true on success.
  //
  // First check if read() would succeed without blocking.
#ifdef USE_PPOLL
  pollfd pollfds[] = {{rfd_, POLLIN, 0}};
  int ret = poll(pollfds, 1, 0);
#else
  fd_set set;
  struct timeval timeout = { 0, 0 };
  FD_ZERO(&set);
  FD_SET(rfd_, &set);
  int ret = select(rfd_ + 1, &set, NULL, NULL, &timeout);
#endif
  if (ret > 0) {
    // Handle potential race condition:
    //  - the above check succeeded, i.e. read() should not block
    //  - the character disappears before we call read()
    //
    // Create a duplicate of rfd_. The duplicate file descriptor dup_rfd_
    // can safely be closed by signal handlers without affecting rfd_.
    dup_rfd_ = dup(rfd_);

    if (dup_rfd_ != -1) {
      struct sigaction act, old_act;
      int ret = 0;

      // Temporarily replace SIGCHLD handler with our own
      memset(&act, 0, sizeof(act));
      act.sa_handler = CloseDupRfd;
      if (sigaction(SIGCHLD, &act, &old_act) == 0) {
        struct itimerval timeout;

        // install a 100ms timeout that generates SIGALARM on expiration
        memset(&timeout, 0, sizeof(timeout));
        timeout.it_value.tv_usec = 100 * 1000; // [ms] -> [usec]
        if (setitimer(ITIMER_REAL, &timeout, NULL) == 0) {
          char buf;

          // Now try to read() from dup_rfd_. Return values from read():
          //
          // 1. token read                               ->  1
          // 2. pipe closed                              ->  0
          // 3. alarm expires                            -> -1 (EINTR)
          // 4. child exits                              -> -1 (EINTR)
          // 5. alarm expired before entering read()     -> -1 (EBADF)
          // 6. child exited before entering read()      -> -1 (EBADF)
          // 7. child exited before handler is installed -> go to 1 - 3
          ret = read(dup_rfd_, &buf, 1);

          // disarm timer
          memset(&timeout, 0, sizeof(timeout));
          setitimer(ITIMER_REAL, &timeout, NULL);
        }

        sigaction(SIGCHLD, &old_act, NULL);
      }

      CloseDupRfd(0);

      // Case 1 from above list
      if (ret > 0)
        return true;
    }
  }

  // read() would block, i.e. no token available,
  // cases 2-6 from above list or
  // select() / poll() / dup() / sigaction() / setitimer() failed
  return false;
}